

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::PickerPrivate::normalizeOffset(PickerPrivate *this)

{
  int iVar1;
  int i;
  ulong uVar2;
  int iVar3;
  
  iVar1 = Picker::count(this->q);
  iVar3 = this->itemsCount;
  if (iVar1 < iVar3) {
    iVar1 = Picker::count(this->q);
    iVar3 = iVar3 - iVar1;
    iVar1 = 0;
    if (0 < iVar3) {
      iVar1 = iVar3 + -1;
    }
    if (-1 < this->drawItemOffset) {
      iVar3 = iVar1 * this->itemTopMargin + iVar3 * this->stringHeight;
      if (this->drawItemOffset <= iVar3) {
        return;
      }
      this->drawItemOffset = iVar3;
      return;
    }
    this->drawItemOffset = 0;
    return;
  }
  iVar3 = this->stringHeight + this->itemTopMargin;
  uVar2 = (long)this->drawItemOffset / (long)iVar3;
  iVar3 = this->drawItemOffset % iVar3;
  iVar1 = (int)uVar2;
  uVar2 = uVar2 & 0xffffffff;
  this->drawItemOffset = iVar3;
  if (iVar1 < 0) {
    for (; (int)uVar2 != 0; uVar2 = (ulong)((int)uVar2 + 1)) {
      makeNextIndex(this,&this->topItemIndex);
    }
  }
  else {
    if (iVar1 == 0) goto LAB_0017e5fc;
    while (iVar3 = (int)uVar2, uVar2 = (ulong)(iVar3 - 1), iVar3 != 0) {
      makePrevIndex(this,&this->topItemIndex);
    }
  }
  iVar3 = this->drawItemOffset;
LAB_0017e5fc:
  if (iVar3 < 1) {
    return;
  }
  this->drawItemOffset = iVar3 - (this->itemTopMargin + this->stringHeight);
  makePrevIndex(this,&this->topItemIndex);
  return;
}

Assistant:

void
PickerPrivate::normalizeOffset()
{
	if( q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		if( drawItemOffset < 0 )
			drawItemOffset = 0;
		else if( drawItemOffset > maxOffset )
			drawItemOffset = maxOffset;
	}
	else
	{
		int fullItemsCount = drawItemOffset /
			( itemTopMargin + stringHeight );

		drawItemOffset -= ( itemTopMargin + stringHeight ) * fullItemsCount;

		if( fullItemsCount < 0 )
		{
			for( int i = fullItemsCount; i < 0; ++i )
				makeNextIndex( topItemIndex );
		}
		else if( fullItemsCount > 0 )
		{
			for( int i = 0; i < fullItemsCount; ++i )
				makePrevIndex( topItemIndex );
		}

		if( drawItemOffset > 0 )
		{
			drawItemOffset -= ( itemTopMargin + stringHeight );
			makePrevIndex( topItemIndex );
		}
	}
}